

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::KillLiveFields
          (GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *fieldsToKill,
          BVSparse<Memory::JitArenaAllocator> *bv)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Loop *local_28;
  Loop *loop;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  BVSparse<Memory::JitArenaAllocator> *fieldsToKill_local;
  GlobOpt *this_local;
  
  if (bv == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0xc2,"(bv)","bv");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (fieldsToKill != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Minus(bv,fieldsToKill);
    bVar2 = IsLoopPrePass(this);
    if (bVar2) {
      for (local_28 = this->rootLoopPrePass; local_28 != (Loop *)0x0; local_28 = local_28->parent) {
        BVSparse<Memory::JitArenaAllocator>::Or(local_28->fieldKilled,fieldsToKill);
      }
    }
  }
  return;
}

Assistant:

void GlobOpt::KillLiveFields(BVSparse<JitArenaAllocator> *const fieldsToKill, BVSparse<JitArenaAllocator> *const bv) const
{
    Assert(bv);

    if (fieldsToKill)
    {
        bv->Minus(fieldsToKill);

        if (this->IsLoopPrePass())
        {
            for (Loop * loop = this->rootLoopPrePass; loop != nullptr; loop = loop->parent)
            {
                loop->fieldKilled->Or(fieldsToKill);
            }
        }
    }
}